

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SIBImporter.cpp
# Opt level: O3

void UnknownChunk(StreamReaderLE *param_1,SIBChunk *chunk)

{
  Logger *this;
  size_t sVar1;
  char temp [5];
  char local_1ad;
  undefined1 local_1ac;
  undefined1 local_1ab;
  undefined1 local_1aa;
  undefined1 local_1a9;
  long *local_1a8;
  long local_198 [2];
  ostringstream local_188 [112];
  ios_base local_118 [264];
  
  local_1ad = (char)((ulong)param_1 >> 0x18);
  local_1ac = (undefined1)((ulong)param_1 >> 0x10);
  local_1ab = (undefined1)(((ulong)param_1 & 0xffffffff) >> 8);
  local_1aa = (undefined1)((ulong)param_1 & 0xffffffff);
  local_1a9 = 0;
  this = Assimp::DefaultLogger::get();
  std::__cxx11::ostringstream::ostringstream(local_188);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,"SIB: Skipping unknown \'",0x17);
  sVar1 = strlen(&local_1ad);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,&local_1ad,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,"\' chunk.",8);
  std::__cxx11::stringbuf::str();
  Assimp::Logger::warn(this,(char *)local_1a8);
  if (local_1a8 != local_198) {
    operator_delete(local_1a8,local_198[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_188);
  std::ios_base::~ios_base(local_118);
  return;
}

Assistant:

static void UnknownChunk(StreamReaderLE* /*stream*/, const SIBChunk& chunk)
{
    char temp[5] = {
        static_cast<char>(( chunk.Tag>>24 ) & 0xff),
        static_cast<char>(( chunk.Tag>>16 ) & 0xff),
        static_cast<char>(( chunk.Tag>>8 ) & 0xff),
        static_cast<char>(chunk.Tag & 0xff), '\0'
    };

    ASSIMP_LOG_WARN((Formatter::format(), "SIB: Skipping unknown '",temp,"' chunk."));
}